

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
             *this,char **it)

{
  int iVar1;
  size_t __n;
  size_t __n_00;
  long lVar2;
  ulong uVar3;
  char *digits;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  size_t __len;
  ptrdiff_t _Num;
  bool bVar9;
  bool bVar10;
  
  __n = *(size_t *)(this + 0x10);
  pcVar6 = *it;
  pcVar4 = pcVar6;
  if (__n != 0) {
    memmove(pcVar6,*(void **)(this + 8),__n);
    pcVar4 = pcVar6 + __n;
    *it = pcVar4;
  }
  __n_00 = *(size_t *)(this + 0x20);
  pcVar7 = pcVar4;
  if (__n_00 != 0) {
    pcVar7 = pcVar4 + __n_00;
    memset(pcVar4,*(int *)(this + 0x18),__n_00);
  }
  *it = pcVar7;
  lVar2 = *(long *)(this + 0x28);
  iVar1 = *(int *)(this + 0x30);
  if (*(char *)(*(long *)(lVar2 + 8) + 8) == 'x') {
    pcVar4 = "0123456789abcdef";
  }
  else {
    pcVar4 = "0123456789ABCDEF";
  }
  pcVar6 = pcVar6 + __n_00 + __n + (long)iVar1;
  uVar5 = *(ulong *)(lVar2 + 0x10);
  uVar8 = *(ulong *)(lVar2 + 0x18);
  do {
    pcVar6 = pcVar6 + -1;
    *pcVar6 = pcVar4[(uint)uVar5 & 0xf];
    bVar9 = 0xf < uVar5;
    bVar10 = uVar8 != 0;
    uVar3 = -uVar8;
    uVar5 = uVar8 << 0x3c | uVar5 >> 4;
    uVar8 = uVar8 >> 4;
  } while (bVar10 || uVar3 < bVar9);
  *it = pcVar7 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }